

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<10>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  int iVar1;
  RepeatedPtrFieldBase *x;
  CodedOutputStream *in_RSI;
  void *in_RDI;
  int i;
  MessageLite *unaff_retaddr;
  RepeatedPtrFieldBase *array;
  int iVar2;
  int idx;
  
  x = Get<google::protobuf::internal::RepeatedPtrFieldBase>(in_RDI);
  iVar2 = 0;
  while( true ) {
    idx = iVar2;
    iVar1 = AccessorHelper::Size((RepeatedPtrFieldBase *)0x5c1b3b);
    if (iVar1 <= iVar2) break;
    WriteTagTo<google::protobuf::io::CodedOutputStream>
              ((uint32)((ulong)x >> 0x20),(CodedOutputStream *)CONCAT44(idx,iVar2));
    AccessorHelper::Get(x,idx);
    SerializeGroupTo<google::protobuf::io::CodedOutputStream>(unaff_retaddr,in_RDI,in_RSI);
    WriteTagTo<google::protobuf::io::CodedOutputStream>
              ((uint32)((ulong)x >> 0x20),(CodedOutputStream *)CONCAT44(idx,iVar2));
    iVar2 = idx + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeGroupTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          static_cast<const SerializationTable*>(md.ptr), output);
      WriteTagTo(md.tag + 1, output);
    }
  }